

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dirichlet_Laplacian_demo.cc
# Opt level: O3

vector<double,_std::allocator<double>_> *
SolveDirLaplSeqMesh<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>&,lf::mesh::utils::MeshFunctionGlobal<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          shared_ptr<lf::mesh::Mesh> *coarse_mesh_p,uint reflevels,
          function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)> *u,
          MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>
          *f)

{
  iterator __position;
  int iVar1;
  int iVar2;
  ulong uVar3;
  MeshHierarchy multi_mesh;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_120;
  undefined1 local_118 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  pointer local_f0;
  MeshHierarchy local_e8;
  
  local_120._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
       operator_new(0x60);
  *(undefined ***)
   local_120._M_t.
   super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
   super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = &PTR_DimWorld_003d7fc8;
  *(undefined4 *)
   ((long)local_120._M_t.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 8) = 2;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x20) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x28) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x30) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x40) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x48) = 0;
  *(long *)((long)local_120._M_t.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined1 *)
   ((long)local_120._M_t.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x58) = 1;
  lf::refinement::MeshHierarchy::MeshHierarchy
            (&local_e8,coarse_mesh_p,
             (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
             &local_120);
  if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
      local_120._M_t.
      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl != (MeshFactory *)0x0) {
    (**(code **)(*(long *)local_120._M_t.
                          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38
                ))();
  }
  local_120._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
       (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)0x0;
  if (reflevels != 0) {
    do {
      lf::refinement::MeshHierarchy::RefineRegular(&local_e8,rp_regular);
      reflevels = reflevels - 1;
    } while (reflevels != 0);
  }
  uVar3 = (ulong)((long)local_e8.meshes_.
                        super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e8.meshes_.
                       super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (int)uVar3;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,uVar3 & 0xffffffff);
  if (iVar2 != 0) {
    iVar1 = 0;
    do {
      lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)local_118,(size_type)&local_e8);
      local_118._16_8_ = local_118._0_8_;
      p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f0 = (pointer)L2ErrorLinearFEDirichletLaplacian<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>&,lf::mesh::utils::MeshFunctionGlobal<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>>&>
                                    ((shared_ptr<const_lf::mesh::Mesh> *)(local_118 + 0x10),u,f);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,(double *)&local_f0);
      }
      else {
        *__position._M_current = (double)local_f0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      iVar1 = iVar1 + 1;
    } while (iVar2 != iVar1);
  }
  lf::refinement::MeshHierarchy::~MeshHierarchy(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> SolveDirLaplSeqMesh(
    const std::shared_ptr<lf::mesh::Mesh> &coarse_mesh_p,
    unsigned int reflevels, SOLFUNCTOR &&u, RHSFUNCTOR &&f) {
  // Prepare for creating a hierarchy of meshes
  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  lf::refinement::MeshHierarchy multi_mesh(coarse_mesh_p,
                                           std::move(mesh_factory_ptr));

  // Perform several steps of regular refinement of the given mesh
  for (unsigned int refstep = 0; refstep < reflevels; ++refstep) {
    // Barycentric refinement is the other option
    multi_mesh.RefineRegular(/*lf::refinement::RefPat::rp_barycentric*/);
  }
  // Solve Dirichlet boundary value problem on every level
  const lf::assemble::size_type L = multi_mesh.NumLevels();
  std::vector<double> errors;
  errors.reserve(L);
  for (unsigned level = 0; level < L; level++) {
    // Register norm of errors
    errors.push_back(
        L2ErrorLinearFEDirichletLaplacian(multi_mesh.getMesh(level), u, f));
  }
  return errors;
}